

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O3

bool __thiscall BufferedReader::incSeek(BufferedReader *this,int readerID,int64_t offset)

{
  char cVar1;
  int iVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  bool bVar5;
  _Rb_tree_header *p_Var6;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_readersMtx);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  p_Var4 = (this->m_readers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var6 = &(this->m_readers)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var6->_M_header;
    do {
      if (readerID <= (int)p_Var4[1]._M_color) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < readerID];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var6) && ((int)p_Var3[1]._M_color <= readerID)) {
      p_Var4 = p_Var3[1]._M_parent;
      cVar1 = (**(code **)(*(long *)p_Var4 + 0x10))(p_Var4,offset);
      if (cVar1 != '\0') {
        *(undefined1 *)((long)&p_Var4->_M_left + 3) = 0;
        *(undefined1 *)((long)&p_Var4->_M_parent + 1) = 0;
        bVar5 = true;
        goto LAB_0017ed3d;
      }
    }
  }
  bVar5 = false;
LAB_0017ed3d:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_readersMtx);
  return bVar5;
}

Assistant:

bool BufferedReader::incSeek(const int readerID, const int64_t offset)
{
    std::lock_guard lock(m_readersMtx);
    const auto itr = m_readers.find(readerID);
    if (itr != m_readers.end())
    {
        ReaderData* data = itr->second;
        const bool rez = data->incSeek(offset);
        if (rez)
        {
            data->m_eof = false;
            data->m_notified = false;
        }
        return rez;
    }
    return false;
}